

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSDDOMParser.cpp
# Opt level: O1

void __thiscall xercesc_4_0::XSDDOMParser::docComment(XSDDOMParser *this,XMLCh *comment)

{
  XMLSize_t XVar1;
  XMLBuffer *this_00;
  XMLSize_t XVar2;
  
  if (-1 < this->fAnnotationDepth) {
    this_00 = &this->fAnnotationBuf;
    XMLBuffer::append(this_00,(XMLCh *)XMLUni::fgCommentString);
    XMLBuffer::append(this_00,comment);
    if ((this->fAnnotationBuf).fIndex == (this->fAnnotationBuf).fCapacity) {
      XMLBuffer::ensureCapacity(this_00,1);
    }
    XVar2 = (this->fAnnotationBuf).fIndex;
    XVar1 = XVar2 + 1;
    (this->fAnnotationBuf).fIndex = XVar1;
    (this->fAnnotationBuf).fBuffer[XVar2] = L'-';
    if (XVar1 == (this->fAnnotationBuf).fCapacity) {
      XMLBuffer::ensureCapacity(this_00,1);
    }
    XVar2 = (this->fAnnotationBuf).fIndex;
    XVar1 = XVar2 + 1;
    (this->fAnnotationBuf).fIndex = XVar1;
    (this->fAnnotationBuf).fBuffer[XVar2] = L'-';
    if (XVar1 == (this->fAnnotationBuf).fCapacity) {
      XMLBuffer::ensureCapacity(this_00,1);
    }
    XVar1 = (this->fAnnotationBuf).fIndex;
    (this->fAnnotationBuf).fIndex = XVar1 + 1;
    (this->fAnnotationBuf).fBuffer[XVar1] = L'>';
  }
  return;
}

Assistant:

void XSDDOMParser::docComment(const XMLCh* const comment)
{
    if (fAnnotationDepth > -1)
    {
        fAnnotationBuf.append(XMLUni::fgCommentString);
        fAnnotationBuf.append(comment);
        fAnnotationBuf.append(chDash);
        fAnnotationBuf.append(chDash);
        fAnnotationBuf.append(chCloseAngle);
    }
}